

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O3

Clause * __thiscall Inferences::PushUnaryMinus::simplify(PushUnaryMinus *this,Clause *cl_)

{
  char cVar1;
  Term *this_00;
  bool bVar2;
  bool bVar3;
  TermList TVar4;
  TermList t;
  Literal *pLVar5;
  ulong uVar6;
  uint n;
  ulong uVar7;
  uint uVar8;
  uint n_00;
  Stack<Kernel::TermList> litStack;
  Stack<Kernel::Literal_*> local_c0;
  uint local_9c;
  Stack<Kernel::TermList> local_98;
  Clause *local_70;
  ulong local_68;
  Inference local_60;
  
  cVar1 = (cl_->super_Unit)._inference.field_0x1;
  if (cVar1 == -0x21 || (byte)(cVar1 + 0x60U) < 0x3e) {
    return cl_;
  }
  uVar7 = *(ulong *)&cl_->field_0x38 & 0xfffff;
  local_c0._capacity = uVar7;
  if (uVar7 == 0) {
    local_c0._stack = (Literal **)0x0;
    local_c0._cursor = (Literal **)0x0;
    local_c0._end = (Literal **)0x0;
  }
  else {
    uVar8 = (int)uVar7 * 8 + 0xfU & 0xfffffff0;
    if (uVar8 == 0) {
      local_c0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar8 < 0x11) {
      local_c0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar8 < 0x19) {
      local_c0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar8 < 0x21) {
      local_c0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar8 < 0x31) {
      local_c0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar8 < 0x41) {
      local_c0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_c0._stack = (Literal **)::operator_new((ulong)uVar8,0x10);
    }
    local_c0._end = local_c0._stack + uVar7;
    local_c0._cursor = local_c0._stack;
    if ((*(ulong *)&cl_->field_0x38 & 0xfffff) != 0) {
      uVar7 = 0;
      bVar3 = false;
      local_70 = cl_;
LAB_00508952:
      this_00 = &cl_->_literals[uVar7]->super_Term;
      uVar8 = Kernel::Term::numTypeArguments(this_00);
      local_68 = uVar7;
      local_9c = Kernel::Term::numTermArguments(this_00);
      local_98._cursor = (TermList *)0x0;
      local_98._end = (TermList *)0x0;
      local_98._capacity = 0;
      local_98._stack = (TermList *)0x0;
      bVar2 = true;
      n_00 = 0;
      n = 0;
      do {
        uVar7 = local_68;
        cl_ = local_70;
        if (bVar2) {
          if (uVar8 <= n) {
            bVar2 = false;
            goto LAB_00508999;
          }
        }
        else {
LAB_00508999:
          if (local_9c <= n_00) goto LAB_00508a2e;
        }
        if ((bVar2) && (uVar8 <= n)) {
          bVar2 = false;
        }
        if (bVar2) {
          TVar4 = Kernel::Term::typeArg(this_00,n);
          n = n + 1;
        }
        else {
          t = Kernel::Term::termArg(this_00,n_00);
          TVar4 = pushUMinus(None,t);
          n_00 = n_00 + 1;
          bVar3 = (bool)(bVar3 | TVar4._content != t._content);
        }
        if (local_98._cursor == local_98._end) {
          Lib::Stack<Kernel::TermList>::expand(&local_98);
        }
        (local_98._cursor)->_content = TVar4._content;
        local_98._cursor = local_98._cursor + 1;
      } while( true );
    }
  }
LAB_00508bb2:
  if (local_c0._stack != (Literal **)0x0) {
    uVar7 = local_c0._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *local_c0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c0._stack;
    }
    else if (uVar7 < 0x11) {
      *local_c0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c0._stack;
    }
    else if (uVar7 < 0x19) {
      *local_c0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c0._stack;
    }
    else if (uVar7 < 0x21) {
      *local_c0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c0._stack;
    }
    else if (uVar7 < 0x31) {
      *local_c0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c0._stack;
    }
    else if (uVar7 < 0x41) {
      *local_c0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c0._stack;
    }
    else {
      operator_delete(local_c0._stack,0x10);
    }
  }
  return cl_;
LAB_00508a2e:
  if (bVar3) {
    pLVar5 = Kernel::Literal::create((Literal *)this_00,local_98._stack);
    cl_ = local_70;
    if (local_c0._cursor == local_c0._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&local_c0);
    }
    *local_c0._cursor = pLVar5;
    uVar7 = local_68;
  }
  else {
    if (local_c0._cursor == local_c0._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&local_c0);
    }
    *local_c0._cursor = (Literal *)this_00;
  }
  local_c0._cursor = local_c0._cursor + 1;
  if ((Clause *)local_98._stack != (Clause *)0x0) {
    uVar6 = local_98._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *(undefined8 *)&(local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98._stack;
    }
    else if (uVar6 < 0x11) {
      *(undefined8 *)&(local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_98._stack;
    }
    else if (uVar6 < 0x19) {
      *(undefined8 *)&(local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_98._stack;
    }
    else if (uVar6 < 0x21) {
      *(undefined8 *)&(local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_98._stack;
    }
    else if (uVar6 < 0x31) {
      *(undefined8 *)&(local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_98._stack;
    }
    else if (uVar6 < 0x41) {
      *(undefined8 *)&(local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_98._stack;
    }
    else {
      operator_delete(local_98._stack,0x10);
    }
  }
  uVar7 = uVar7 + 1;
  if (((uint)*(undefined8 *)&cl_->field_0x38 & 0xfffff) <= uVar7) goto code_r0x00508b83;
  goto LAB_00508952;
code_r0x00508b83:
  if (bVar3) {
    local_98._capacity = CONCAT71(local_98._capacity._1_7_,0x21);
    local_98._stack = (TermList *)cl_;
    Kernel::Inference::Inference(&local_60,(SimplifyingInference1 *)&local_98);
    cl_ = Kernel::Clause::fromStack(&local_c0,&local_60);
  }
  goto LAB_00508bb2;
}

Assistant:

Clause* PushUnaryMinus::simplify(Clause* cl_) 
{
  DEBUG("in:  ", *cl_)
  if (cl_->isTheoryAxiom()) 
    return cl_;

  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;

  for (unsigned i = 0; i < cl.size(); i++) {
    auto litIn = cl[i];
    auto litStack = concatIters(
        typeArgIter(litIn),
        termArgIter(litIn)
          .map([&](auto tIn) {
            auto tOut = pushUMinus(UMinus::None, tIn);
            changed = changed || tIn != tOut;
            return tOut;
          })
        ).template collect<Stack>();
    if(changed){
      auto litOut = Literal::create(litIn, litStack.begin());
      out.push(litOut);
    } else {
      out.push(litIn);
    }
  }

  if (!changed) {
    return cl_;
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(InferenceRule::EVALUATION, cl_));
    DEBUG("out: ", *result)
    return result;
  }
}